

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O1

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  
  pdVar2 = *(double **)((long)y->content + 0x10);
  dVar4 = pdVar2[1];
  dVar3 = *(double *)((long)user_data + 8) * dVar4 * pdVar2[2] - *user_data * *pdVar2;
  pdVar2 = *(double **)((long)ydot->content + 0x10);
  dVar1 = *(double *)((long)user_data + 0x10);
  *pdVar2 = dVar3;
  dVar4 = dVar1 * dVar4 * dVar4;
  pdVar2[2] = dVar4;
  pdVar2[1] = -dVar3 - dVar4;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype y1, y2, y3, yd1, yd3;
  UserData data;
  sunrealtype p1, p2, p3;

  y1   = Ith(y, 1);
  y2   = Ith(y, 2);
  y3   = Ith(y, 3);
  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  yd1 = Ith(ydot, 1) = -p1 * y1 + p2 * y2 * y3;
  yd3 = Ith(ydot, 3) = p3 * y2 * y2;
  Ith(ydot, 2)       = -yd1 - yd3;

  return (0);
}